

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Int64Parameter::MergePartialFromCodedStream
          (Int64Parameter *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  Int64Range *this_00;
  ulong extraout_RAX;
  Int64Set *this_01;
  ulong extraout_RAX_00;
  int iVar8;
  char cVar9;
  ulong uVar10;
  pair<unsigned_long,_bool> pVar11;
  int local_38;
  int local_34;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00251f70;
      input->buffer_ = pbVar3 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00251f70:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    uVar6 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto LAB_00251f91;
    uVar7 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar7 == 0xb) {
      if (cVar9 != 'Z') goto LAB_00251f91;
      if (this->_oneof_case_[0] != 0xb) {
        clear_AllowedValues(this);
        this->_oneof_case_[0] = 0xb;
        this_01 = (Int64Set *)operator_new(0x28);
        Int64Set::Int64Set(this_01);
        (this->AllowedValues_).set_ = this_01;
      }
      MergePartialFromCodedStream();
      iVar8 = local_38;
      uVar10 = extraout_RAX_00;
joined_r0x002520dd:
      if ((uVar10 & 1) != 0) goto LAB_00251fbc;
LAB_00251fba:
      iVar8 = 0;
    }
    else if (uVar7 == 10) {
      if (cVar9 == 'R') {
        if (this->_oneof_case_[0] != 10) {
          clear_AllowedValues(this);
          this->_oneof_case_[0] = 10;
          this_00 = (Int64Range *)operator_new(0x28);
          Int64Range::Int64Range(this_00);
          (this->AllowedValues_).range_ = this_00;
        }
        MergePartialFromCodedStream();
        iVar8 = local_34;
        uVar10 = extraout_RAX;
        goto joined_r0x002520dd;
      }
LAB_00251f91:
      iVar8 = 7;
      if ((uVar6 & 7) != 4 && uVar6 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
        if (bVar5) goto LAB_00251fba;
        iVar8 = 6;
      }
    }
    else {
      if ((uVar7 != 1) || (cVar9 != '\b')) goto LAB_00251f91;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar11._8_8_ = 1;
        pVar11.first = (long)(char)uVar2;
      }
      else {
        pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      iVar8 = 6;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->defaultvalue_ = pVar11.first;
        goto LAB_00251fba;
      }
    }
LAB_00251fbc:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool Int64Parameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Int64Parameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 defaultValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &defaultvalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Range range = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Set set = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_set()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Int64Parameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Int64Parameter)
  return false;
#undef DO_
}